

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

Array<capnp::word> * __thiscall
capnp::messageToFlatArray
          (Array<capnp::word> *__return_storage_ptr__,capnp *this,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  uint64_t *puVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *__dest;
  bool bVar2;
  size_t sVar3;
  word *pwVar4;
  ulong uVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  Array<capnp::word> *other;
  uint uVar7;
  Fault local_c8;
  Fault f;
  word **local_b8;
  undefined1 local_b0 [8];
  DebugComparison<capnp::word_*&,_capnp::word_*> _kjCondition;
  ArrayPtr<const_capnp::word> *segment;
  ArrayPtr<const_capnp::word> *__end1;
  ArrayPtr<const_capnp::word> *__begin1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *__range1;
  word *dst;
  uint i;
  word *local_50;
  WireValue<uint32_t> *table;
  ArrayPtr<const_capnp::word> *pAStack_40;
  undefined1 local_38 [8];
  Array<capnp::word> result;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  pAStack_40 = segments.ptr;
  segments_00.size_ = (size_t)pAStack_40;
  segments_00.ptr = (ArrayPtr<const_capnp::word> *)this;
  table = (WireValue<uint32_t> *)this;
  result.disposer = (ArrayDisposer *)this;
  sVar3 = computeSerializedSizeInWords(segments_00);
  kj::heapArray<capnp::word>((Array<capnp::word> *)local_38,sVar3);
  pwVar4 = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_38);
  local_50 = pwVar4;
  sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  _::DirectWireValue<unsigned_int>::set((DirectWireValue<unsigned_int> *)pwVar4,(int)sVar3 - 1);
  dst._0_4_ = 0;
  while( true ) {
    uVar5 = (ulong)(uint)dst;
    sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
    if (sVar3 <= uVar5) break;
    uVar7 = (uint)dst + 1;
    puVar1 = &local_50->content;
    pAVar6 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer,
                        (ulong)(uint)dst);
    sVar3 = kj::ArrayPtr<const_capnp::word>::size(pAVar6);
    _::DirectWireValue<unsigned_int>::set
              ((DirectWireValue<unsigned_int> *)((long)puVar1 + (ulong)uVar7 * 4),(uint)sVar3);
    dst._0_4_ = (uint)dst + 1;
  }
  sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  pwVar4 = local_50;
  if ((sVar3 & 1) == 0) {
    sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
    _::DirectWireValue<unsigned_int>::set
              ((DirectWireValue<unsigned_int> *)((long)&pwVar4->content + sVar3 * 4 + 4),0);
  }
  pwVar4 = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_38);
  sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
             ((long)&pwVar4[1].content + (sVar3 & 0xfffffffffffffffe) * 4);
  __end1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::begin
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  pAVar6 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::end
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&result.disposer);
  for (; __dest = __range1, __end1 != pAVar6; __end1 = __end1 + 1) {
    _kjCondition._32_8_ = __end1;
    pwVar4 = kj::ArrayPtr<const_capnp::word>::begin(__end1);
    sVar3 = kj::ArrayPtr<const_capnp::word>::size
                      ((ArrayPtr<const_capnp::word> *)_kjCondition._32_8_);
    memcpy(__dest,pwVar4,sVar3 << 3);
    sVar3 = kj::ArrayPtr<const_capnp::word>::size
                      ((ArrayPtr<const_capnp::word> *)_kjCondition._32_8_);
    __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)(&__range1->ptr + sVar3);
  }
  local_b8 = (word **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(word **)&__range1);
  f.exception = (Exception *)kj::Array<capnp::word>::end((Array<capnp::word> *)local_38);
  kj::_::DebugExpression<capnp::word*&>::operator==
            ((DebugComparison<capnp::word_*&,_capnp::word_*> *)local_b0,
             (DebugExpression<capnp::word*&> *)&local_b8,(word **)&f);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word*&,capnp::word*>&,char_const(&)[43]>
              (&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0x95,FAILED,"dst == result.end()",
               "_kjCondition,\"Buffer overrun/underrun bug in code above.\"",
               (DebugComparison<capnp::word_*&,_capnp::word_*> *)local_b0,
               (char (*) [43])"Buffer overrun/underrun bug in code above.");
    kj::_::Debug::Fault::fatal(&local_c8);
  }
  other = kj::mv<kj::Array<capnp::word>>((Array<capnp::word> *)local_38);
  kj::Array<capnp::word>::Array(__return_storage_ptr__,other);
  kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<word> messageToFlatArray(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  kj::Array<word> result = kj::heapArray<word>(computeSerializedSizeInWords(segments));

  _::WireValue<uint32_t>* table =
      reinterpret_cast<_::WireValue<uint32_t>*>(result.begin());

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);

  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }

  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  word* dst = result.begin() + segments.size() / 2 + 1;

  for (auto& segment: segments) {
    memcpy(dst, segment.begin(), segment.size() * sizeof(word));
    dst += segment.size();
  }

  KJ_DASSERT(dst == result.end(), "Buffer overrun/underrun bug in code above.");

  return kj::mv(result);
}